

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xatlas.cpp
# Opt level: O0

Vector3 __thiscall xatlas::internal::Mesh::computeFaceNormal(Mesh *this,uint32_t face)

{
  Array<xatlas::internal::Vector3> *this_00;
  uint *puVar1;
  Vector3 *b;
  Vector3 *a;
  Array<unsigned_int> *this_01;
  Vector3 VVar2;
  Vector3 local_ac;
  Vector3 local_a0;
  undefined1 local_90 [8];
  Vector3 normalAreaScaled;
  float fStack_7c;
  float local_78;
  undefined1 local_70 [8];
  Vector3 e1;
  float fStack_5c;
  float local_58;
  undefined1 local_50 [8];
  Vector3 e0;
  Vector3 *p2;
  Vector3 *p1;
  Vector3 *p0;
  uint32_t face_local;
  Mesh *this_local;
  
  this_00 = &this->m_positions;
  this_01 = &this->m_indices;
  puVar1 = Array<unsigned_int>::operator[](this_01,face * 3);
  b = Array<xatlas::internal::Vector3>::operator[](this_00,*puVar1);
  puVar1 = Array<unsigned_int>::operator[](this_01,face * 3 + 1);
  a = Array<xatlas::internal::Vector3>::operator[](this_00,*puVar1);
  puVar1 = Array<unsigned_int>::operator[](this_01,face * 3 + 2);
  register0x00000000 = Array<xatlas::internal::Vector3>::operator[](this_00,*puVar1);
  VVar2 = operator-(register0x00000000,b);
  local_58 = VVar2.z;
  e0.x = local_58;
  stack0xffffffffffffffa0 = VVar2._0_8_;
  local_50._0_4_ = e1.z;
  local_50._4_4_ = fStack_5c;
  unique0x10000143 = VVar2;
  VVar2 = operator-(a,b);
  local_78 = VVar2.z;
  e1.x = local_78;
  stack0xffffffffffffff80 = VVar2._0_8_;
  local_70._0_4_ = normalAreaScaled.z;
  local_70._4_4_ = fStack_7c;
  unique0x10000137 = VVar2;
  VVar2 = cross((Vector3 *)local_50,(Vector3 *)local_70);
  local_a0.z = VVar2.z;
  normalAreaScaled.x = local_a0.z;
  local_a0._0_8_ = VVar2._0_8_;
  local_90._0_4_ = local_a0.x;
  local_90._4_4_ = local_a0.y;
  local_a0 = VVar2;
  Vector3::Vector3(&local_ac,0.0,0.0,1.0);
  VVar2 = normalizeSafe((Vector3 *)local_90,&local_ac,0.0);
  return VVar2;
}

Assistant:

Vector3 computeFaceNormal(uint32_t face) const
	{
		const Vector3 &p0 = m_positions[m_indices[face * 3 + 0]];
		const Vector3 &p1 = m_positions[m_indices[face * 3 + 1]];
		const Vector3 &p2 = m_positions[m_indices[face * 3 + 2]];
		const Vector3 e0 = p2 - p0;
		const Vector3 e1 = p1 - p0;
		const Vector3 normalAreaScaled = cross(e0, e1);
		return normalizeSafe(normalAreaScaled, Vector3(0, 0, 1), 0.0f);
	}